

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.cc
# Opt level: O1

void Minisat::limitTime(uint32_t max_cpu_time)

{
  int iVar1;
  rlimit rl;
  rlimit local_20;
  
  if (max_cpu_time != 0) {
    getrlimit(RLIMIT_CPU,&local_20);
    if ((max_cpu_time < local_20.rlim_max) &&
       (local_20.rlim_cur = (ulong)max_cpu_time, iVar1 = setrlimit(RLIMIT_CPU,&local_20),
       iVar1 == -1)) {
      puts("WARNING! Could not set resource limit: CPU-time.");
    }
  }
  return;
}

Assistant:

void Minisat::limitTime(uint32_t max_cpu_time)
{
    if (max_cpu_time != 0){
        rlimit rl;
        getrlimit(RLIMIT_CPU, &rl);
        if (rl.rlim_max == RLIM_INFINITY || (rlim_t)max_cpu_time < rl.rlim_max){
            rl.rlim_cur = max_cpu_time;
            if (setrlimit(RLIMIT_CPU, &rl) == -1)
                printf("WARNING! Could not set resource limit: CPU-time.\n");
        }
    }
}